

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int slurp_central_directory(archive_read *a,_7zip_conflict *zip,_7z_header_info *header)

{
  int iVar1;
  uint32_t uVar2;
  uint uVar3;
  int iVar4;
  archive_read *a_00;
  uint64_t uVar5;
  archive_entry *paVar6;
  int64_t iVar7;
  byte *pbVar8;
  int *piVar9;
  uchar *puVar10;
  ssize_t in_RDX;
  archive_read *in_RSI;
  archive *in_RDI;
  int r;
  int check_header_crc;
  ssize_t bytes_avail;
  uint32_t next_header_crc;
  uint64_t next_header_size;
  uint64_t next_header_offset;
  uchar *p;
  int in_stack_0000007c;
  _7z_folder *in_stack_00000080;
  archive_read *in_stack_00000088;
  size_t in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffb0;
  archive_read *in_stack_ffffffffffffffb8;
  uint32_t local_3c;
  int *local_28;
  int local_4;
  
  local_28 = (int *)__archive_read_ahead
                              ((archive_read *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                               in_stack_ffffffffffffff98,(ssize_t *)0x1a8437);
  if (local_28 == (int *)0x0) {
    return -0x1e;
  }
  if ((((char)*local_28 == 'M') && (*(char *)((long)local_28 + 1) == 'Z')) ||
     (*local_28 == 0x464c457f)) {
    in_stack_ffffffffffffffb0 = skip_sfx(in_RSI,in_RDX);
    if (in_stack_ffffffffffffffb0 < -0x14) {
      return in_stack_ffffffffffffffb0;
    }
    local_28 = (int *)__archive_read_ahead
                                ((archive_read *)
                                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                 in_stack_ffffffffffffff98,(ssize_t *)0x1a84bc);
    if (local_28 == (int *)0x0) {
      return -0x1e;
    }
  }
  in_RSI->skip_file_ino = in_RSI->skip_file_ino + 0x20;
  iVar1 = memcmp(local_28,anon_var_dwarf_35caa,6);
  if (iVar1 == 0) {
    a_00 = (archive_read *)crc32(0,local_28 + 3,0x14);
    uVar2 = archive_le32dec(local_28 + 2);
    if (a_00 == (archive_read *)(ulong)uVar2) {
      uVar5 = archive_le64dec((void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
      ;
      paVar6 = (archive_entry *)
               archive_le64dec((void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                              );
      local_3c = archive_le32dec(local_28 + 7);
      if (paVar6 == (archive_entry *)0x0) {
        local_4 = 1;
      }
      else if ((long)uVar5 < 0) {
        archive_set_error(in_RDI,-1,"Malformed 7-Zip archive");
        local_4 = -0x1e;
      }
      else {
        __archive_read_consume
                  ((archive_read *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff98);
        if (uVar5 != 0) {
          if ((long)in_stack_ffffffffffffffb8 < (long)uVar5) {
            iVar7 = __archive_read_seek((archive_read *)
                                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0
                                                ),in_stack_ffffffffffffff98,0);
            if (iVar7 < 0) {
              return -0x1e;
            }
          }
          else {
            __archive_read_consume
                      ((archive_read *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                       ,in_stack_ffffffffffffff98);
          }
        }
        (in_RSI->client).position = uVar5;
        in_RSI->skip_file_dev = uVar5;
        in_RSI->entry = paVar6;
        *(undefined8 *)&in_RSI->skip_file_set = 0;
        *(undefined4 *)((long)&(in_RSI->archive).sconv + 4) = 0;
        *(undefined4 *)&(in_RSI->archive).sconv = 1;
        *(undefined4 *)&in_RSI[8].formats[5].read_header = 0;
        iVar1 = 1;
        pbVar8 = header_bytes(in_stack_ffffffffffffffb8,CONCAT44(1,in_stack_ffffffffffffffb0));
        if (pbVar8 == (byte *)0x0) {
          archive_set_error(in_RDI,0x54,"Truncated 7-Zip file body");
          local_4 = -0x1e;
        }
        else {
          uVar3 = (uint)*pbVar8;
          if (uVar3 != 1) {
            if (uVar3 != 0x17) {
              archive_set_error(in_RDI,-1,"Unexpected Property ID = %X",(ulong)*pbVar8);
              return -0x1e;
            }
            iVar4 = decode_encoded_header_info
                              (a_00,(_7z_stream_info *)
                                    (ulong)CONCAT14(*pbVar8,in_stack_ffffffffffffffa0));
            if ((iVar4 == 0) && (*(ulong *)&in_RSI->skip_file_set != (ulong)local_3c)) {
              archive_set_error(in_RDI,-1,"Damaged 7-Zip archive");
              iVar4 = -1;
            }
            if (iVar4 == 0) {
              if ((in_RSI->archive).error[0x48] == '\0') {
                iVar1 = 0;
              }
              else {
                local_3c = *(uint32_t *)((in_RSI->archive).error + 0x4c);
              }
              if (in_RSI->bidders[0].init != (_func_int_archive_read_filter_ptr *)0x0) {
                read_consume((archive_read *)CONCAT44(uVar3,in_stack_ffffffffffffffa0));
              }
              iVar4 = setup_decode_folder(in_stack_00000088,in_stack_00000080,in_stack_0000007c);
              if (iVar4 == 0) {
                in_RSI->entry = (archive_entry *)in_RSI->bidders[0].data;
                iVar4 = seek_pack(a_00);
              }
            }
            free_StreamsInfo((_7z_stream_info *)0x1a8828);
            memset(in_RSI,0,0x68);
            if (iVar4 < 0) {
              return -0x1e;
            }
            *(undefined4 *)((long)&(in_RSI->archive).sconv + 4) = 1;
            *(undefined8 *)&in_RSI->skip_file_set = 0;
          }
          piVar9 = __errno_location();
          *piVar9 = 0;
          iVar4 = read_Header((archive_read *)next_header_offset,(_7z_header_info *)next_header_size
                              ,next_header_crc);
          if (iVar4 < 0) {
            piVar9 = __errno_location();
            if (*piVar9 == 0xc) {
              archive_set_error(in_RDI,-1,"Couldn\'t allocate memory");
            }
            else {
              archive_set_error(in_RDI,-1,"Damaged 7-Zip archive");
            }
            local_4 = -0x1e;
          }
          else {
            puVar10 = header_bytes(in_stack_ffffffffffffffb8,CONCAT44(iVar1,iVar4));
            if ((puVar10 == (uchar *)0x0) || (*puVar10 != '\0')) {
              archive_set_error(in_RDI,-1,"Malformed 7-Zip archive");
              local_4 = -0x1e;
            }
            else if ((iVar1 == 0) || (*(ulong *)&in_RSI->skip_file_set == (ulong)local_3c)) {
              *(undefined4 *)((long)&in_RSI->bidders[0].name + 4) = 0;
              *(undefined4 *)&in_RSI->bidders[0].name = 0;
              in_RSI->bidders[0].data = (void *)0x0;
              (in_RSI->client).nodes = 0;
              (in_RSI->client).cursor = 0;
              in_RSI->bidders[0].init = (_func_int_archive_read_filter_ptr *)0x0;
              *(undefined4 *)&(in_RSI->archive).sconv = 0;
              local_4 = 0;
            }
            else {
              archive_set_error(in_RDI,-1,"Malformed 7-Zip archive");
              local_4 = -0x1e;
            }
          }
        }
      }
    }
    else {
      archive_set_error(in_RDI,-1,"Header CRC error");
      local_4 = -0x1e;
    }
  }
  else {
    archive_set_error(in_RDI,-1,"Not 7-Zip archive file");
    local_4 = -0x1e;
  }
  return local_4;
}

Assistant:

static int
slurp_central_directory(struct archive_read *a, struct _7zip *zip,
    struct _7z_header_info *header)
{
	const unsigned char *p;
	uint64_t next_header_offset;
	uint64_t next_header_size;
	uint32_t next_header_crc;
	ssize_t bytes_avail;
	int check_header_crc, r;

	if ((p = __archive_read_ahead(a, 32, &bytes_avail)) == NULL)
		return (ARCHIVE_FATAL);

	if ((p[0] == 'M' && p[1] == 'Z') || memcmp(p, "\x7F\x45LF", 4) == 0) {
		/* This is an executable ? Must be self-extracting... */
		r = skip_sfx(a, bytes_avail);
		if (r < ARCHIVE_WARN)
			return (r);
		if ((p = __archive_read_ahead(a, 32, &bytes_avail)) == NULL)
			return (ARCHIVE_FATAL);
	}
	zip->seek_base += 32;

	if (memcmp(p, _7ZIP_SIGNATURE, 6) != 0) {
		archive_set_error(&a->archive, -1, "Not 7-Zip archive file");
		return (ARCHIVE_FATAL);
	}

	/* CRC check. */
	if (crc32(0, (const unsigned char *)p + 12, 20)
	    != archive_le32dec(p + 8)) {
		archive_set_error(&a->archive, -1, "Header CRC error");
		return (ARCHIVE_FATAL);
	}

	next_header_offset = archive_le64dec(p + 12);
	next_header_size = archive_le64dec(p + 20);
	next_header_crc = archive_le32dec(p + 28);

	if (next_header_size == 0)
		/* There is no entry in an archive file. */
		return (ARCHIVE_EOF);

	if (((int64_t)next_header_offset) < 0) {
		archive_set_error(&a->archive, -1, "Malformed 7-Zip archive");
		return (ARCHIVE_FATAL);
	}
	__archive_read_consume(a, 32);
	if (next_header_offset != 0) {
		if (bytes_avail >= (ssize_t)next_header_offset)
			__archive_read_consume(a, next_header_offset);
		else if (__archive_read_seek(a,
		    next_header_offset + zip->seek_base, SEEK_SET) < 0)
			return (ARCHIVE_FATAL);
	}
	zip->stream_offset = next_header_offset;
	zip->header_offset = next_header_offset;
	zip->header_bytes_remaining = next_header_size;
	zip->header_crc32 = 0;
	zip->header_is_encoded = 0;
	zip->header_is_being_read = 1;
	zip->has_encrypted_entries = 0;
	check_header_crc = 1;

	if ((p = header_bytes(a, 1)) == NULL) {
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated 7-Zip file body");
		return (ARCHIVE_FATAL);
	}
	/* Parse ArchiveProperties. */
	switch (p[0]) {
	case kEncodedHeader:
		/*
		 * The archive has an encoded header and we have to decode it
		 * in order to parse the header correctly.
		 */
		r = decode_encoded_header_info(a, &(zip->si));

		/* Check the EncodedHeader CRC.*/
		if (r == 0 && zip->header_crc32 != next_header_crc) {
			archive_set_error(&a->archive, -1,
			    "Damaged 7-Zip archive");
			r = -1;
		}
		if (r == 0) {
			if (zip->si.ci.folders[0].digest_defined)
				next_header_crc = zip->si.ci.folders[0].digest;
			else
				check_header_crc = 0;
			if (zip->pack_stream_bytes_unconsumed)
				read_consume(a);
			r = setup_decode_folder(a, zip->si.ci.folders, 1);
			if (r == 0) {
				zip->header_bytes_remaining =
					zip->folder_outbytes_remaining;
				r = seek_pack(a);
			}
		}
		/* Clean up StreamsInfo. */
		free_StreamsInfo(&(zip->si));
		memset(&(zip->si), 0, sizeof(zip->si));
		if (r < 0)
			return (ARCHIVE_FATAL);
		zip->header_is_encoded = 1;
		zip->header_crc32 = 0;
		/* FALL THROUGH */
	case kHeader:
		/*
		 * Parse the header.
		 */
		errno = 0;
		r = read_Header(a, header, zip->header_is_encoded);
		if (r < 0) {
			if (errno == ENOMEM)
				archive_set_error(&a->archive, -1,
				    "Couldn't allocate memory");
			else
				archive_set_error(&a->archive, -1,
				    "Damaged 7-Zip archive");
			return (ARCHIVE_FATAL);
		}

		/*
		 *  Must be kEnd.
		 */
		if ((p = header_bytes(a, 1)) == NULL ||*p != kEnd) {
			archive_set_error(&a->archive, -1,
			    "Malformed 7-Zip archive");
			return (ARCHIVE_FATAL);
		}

		/* Check the Header CRC.*/
		if (check_header_crc && zip->header_crc32 != next_header_crc) {
			archive_set_error(&a->archive, -1,
			    "Malformed 7-Zip archive");
			return (ARCHIVE_FATAL);
		}
		break;
	default:
		archive_set_error(&a->archive, -1,
		    "Unexpected Property ID = %X", p[0]);
		return (ARCHIVE_FATAL);
	}

	/* Clean up variables be used for decoding the archive header */
	zip->pack_stream_remaining = 0;
	zip->pack_stream_index = 0;
	zip->folder_outbytes_remaining = 0;
	zip->uncompressed_buffer_bytes_remaining = 0;
	zip->pack_stream_bytes_unconsumed = 0;
	zip->header_is_being_read = 0;

	return (ARCHIVE_OK);
}